

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O0

int __thiscall TPZPolynomial::GetRoots(TPZPolynomial *this,TPZVec<double> *r)

{
  double *pdVar1;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  int i;
  int local_1c;
  TPZVec<double> *this_00;
  
  local_1c = 0;
  this_00 = in_RDI;
  while( true ) {
    if (2 < local_1c) {
      TPZVec<double>::operator=(this_00,in_RSI);
      return 1;
    }
    pdVar1 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI->fStore,(long)local_1c);
    if ((*pdVar1 == -99.999) && (!NAN(*pdVar1))) break;
    local_1c = local_1c + 1;
  }
  std::operator<<((ostream *)&std::cout,
                  "TPZPolynomial::GetRoots.\nERRO: Coeficientes ainda nao foram especificados.\n");
  return -1;
}

Assistant:

int TPZPolynomial::GetRoots(TPZVec<REAL> & r) {
    int i;
    for (i = 0; i < 3; i++)
        if (fCo[i] == -99.999) {
            cout << "TPZPolynomial::GetRoots.\nERRO: Coeficientes ainda nao foram especificados.\n";
            return -1;
        }
	r  = fReal;
    return 1;
}